

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_RK4.cpp
# Opt level: O1

double * __thiscall PP_RK4::RK4step(PP_RK4 *this,double x,double y,double z,double t,double dt)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  undefined4 extraout_var;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  iVar4 = (**this->_vptr_PP_RK4)();
  pdVar5 = (double *)CONCAT44(extraout_var,iVar4);
  dVar1 = *pdVar5;
  *pdVar5 = dVar1 * dt;
  dVar2 = pdVar5[1];
  pdVar5[1] = dVar2 * dt;
  dVar3 = pdVar5[2];
  pdVar5[2] = dVar3 * dt;
  iVar4 = (**this->_vptr_PP_RK4)
                    (dVar1 * dt * 0.5 + x,dVar2 * dt * 0.5 + y,dVar3 * dt * 0.5 + z,this);
  pdVar6 = (double *)CONCAT44(extraout_var_00,iVar4);
  dVar1 = *pdVar6;
  *pdVar6 = dVar1 * dt;
  dVar2 = pdVar6[1];
  pdVar6[1] = dVar2 * dt;
  dVar3 = pdVar6[2];
  pdVar6[2] = dVar3 * dt;
  iVar4 = (**this->_vptr_PP_RK4)
                    (dVar1 * dt * 0.5 + x,dVar2 * dt * 0.5 + y,dVar3 * dt * 0.5 + z,dt * 0.5 + t,
                     this);
  pdVar7 = (double *)CONCAT44(extraout_var_01,iVar4);
  dVar1 = *pdVar7;
  *pdVar7 = dVar1 * dt;
  dVar2 = pdVar7[1];
  pdVar7[1] = dVar2 * dt;
  dVar3 = pdVar7[2];
  pdVar7[2] = dVar3 * dt;
  iVar4 = (**this->_vptr_PP_RK4)(dVar1 * dt + x,dVar2 * dt + y,dVar3 * dt + z,t + dt,this);
  pdVar8 = (double *)CONCAT44(extraout_var_02,iVar4);
  dVar1 = *pdVar8;
  *pdVar8 = dVar1 * dt;
  dVar2 = pdVar8[1];
  pdVar8[1] = dVar2 * dt;
  dVar3 = pdVar8[2];
  pdVar8[2] = dt * dVar3;
  pdVar9 = (double *)operator_new__(0x18);
  *pdVar9 = (*pdVar7 + *pdVar7 + *pdVar6 + *pdVar6 + *pdVar5 + dVar1 * dt) * 0.16666666666666666;
  pdVar9[1] = (pdVar7[1] + pdVar7[1] + pdVar6[1] + pdVar6[1] + pdVar5[1] + dVar2 * dt) *
              0.16666666666666666;
  pdVar9[2] = (pdVar7[2] + pdVar7[2] + pdVar6[2] + pdVar6[2] + pdVar5[2] + dt * dVar3) *
              0.16666666666666666;
  operator_delete(pdVar5,8);
  operator_delete(pdVar6,8);
  operator_delete(pdVar7,8);
  operator_delete(pdVar8,8);
  return pdVar9;
}

Assistant:

double* PP_RK4::RK4step(double x, double y, double z, double t, double dt)
{
    double* K1 = RK4K1(x, y, z, t, dt);
    double* K2 = RK4K2(x, y, z, K1[0], K1[1], K1[2], t, dt);
    double* K3 = RK4K3(x, y, z, K2[0], K2[1], K2[2], t, dt);
    double* K4 = RK4K4(x, y, z, K3[0], K3[1], K3[2], t, dt);
    double* dr = new double[3];
    dr[0] = (1.0/6.0)*(K1[0] + 2.0*K2[0] + 2*K3[0] + K4[0]);
    dr[1] = (1.0/6.0)*(K1[1] + 2.0*K2[1] + 2*K3[1] + K4[1]);
    dr[2] = (1.0/6.0)*(K1[2] + 2.0*K2[2] + 2*K3[2] + K4[2]);
    delete K1;
    delete K2;
    delete K3;
    delete K4;
    return dr;
}